

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O0

void __thiscall Utils::ArgumentParser::~ArgumentParser(ArgumentParser *this)

{
  bool bVar1;
  reference ppVVar2;
  reference ppAVar3;
  reference ppVar4;
  reference ppVar5;
  undefined1 local_f0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>
  i_4;
  iterator __end1_4;
  iterator __begin1_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>_>
  *__range1_4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
  i_3;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>_>
  *__range1_3;
  ArgFlag *i_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_> *__range1_2;
  ValueArgObj *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_> *__range1_1;
  ValueArgObj *i;
  iterator __end1;
  iterator __begin1;
  vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_> *__range1;
  ArgumentParser *this_local;
  
  __end1 = std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::begin
                     (&this->positionals);
  i = (ValueArgObj *)
      std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::end
                (&this->positionals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Utils::ValueArgObj_**,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<Utils::ValueArgObj_**,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
              ::operator*(&__end1);
    if (*ppVVar2 != (ValueArgObj *)0x0) {
      (*((*ppVVar2)->super_ArgObject)._vptr_ArgObject[1])();
    }
    __gnu_cxx::
    __normal_iterator<Utils::ValueArgObj_**,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::begin
                       (&this->options);
  i_1 = (ValueArgObj *)
        std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::end
                  (&this->options);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Utils::ValueArgObj_**,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
                        *)&i_1);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<Utils::ValueArgObj_**,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
              ::operator*(&__end1_1);
    if (*ppVVar2 != (ValueArgObj *)0x0) {
      (*((*ppVVar2)->super_ArgObject)._vptr_ArgObject[1])();
    }
    __gnu_cxx::
    __normal_iterator<Utils::ValueArgObj_**,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::begin(&this->flags);
  i_2 = (ArgFlag *)
        std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::end(&this->flags);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<Utils::ArgFlag_**,_std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>_>
                        *)&i_2);
    if (!bVar1) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<Utils::ArgFlag_**,_std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>_>
              ::operator*(&__end1_2);
    if (*ppAVar3 != (ArgFlag *)0x0) {
      (*((*ppAVar3)->super_ArgObject)._vptr_ArgObject[1])();
    }
    __gnu_cxx::
    __normal_iterator<Utils::ArgFlag_**,_std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>_>
             ::begin(&this->option_mapping);
  i_3.second = (ValueArgObj *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>_>
               ::end(&this->option_mapping);
  while( true ) {
    bVar1 = std::operator!=(&__end1_3,(_Self *)&i_3.second);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>
             ::operator*(&__end1_3);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
            *)&__range1_4,ppVar4);
    i_3.first.field_2._8_8_ = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
             *)&__range1_4);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>
    ::operator++(&__end1_3);
  }
  __end1_4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>_>
             ::begin(&this->flag_mapping);
  i_4.second = (ArgObject *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>_>
               ::end(&this->flag_mapping);
  while( true ) {
    bVar1 = std::operator!=(&__end1_4,(_Self *)&i_4.second);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>
             ::operator*(&__end1_4);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>
            *)local_f0,ppVar5);
    i_4.first.field_2._8_8_ = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>
             *)local_f0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>
    ::operator++(&__end1_4);
  }
  std::__cxx11::string::~string((string *)&this->long_text);
  std::__cxx11::string::~string((string *)&this->short_text);
  std::__cxx11::string::~string((string *)&this->program_name);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>_>
  ::~map(&this->flag_mapping);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>_>
  ::~map(&this->option_mapping);
  std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::~vector(&this->flags);
  std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::~vector(&this->options);
  std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::~vector
            (&this->positionals);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->used_identifier);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->used_name);
  return;
}

Assistant:

inline ArgumentParser::~ArgumentParser() {
    for ( auto i : positionals ) delete i;
    for ( auto i : options  )    delete i;
    for ( auto i : flags )       delete i;

    for ( auto i : option_mapping ) i.second = nullptr;
    for ( auto i : flag_mapping )   i.second = nullptr;
}